

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_json.cpp
# Opt level: O1

ErrorStackOption *
ritobin::io::json_impl::json_value_impl<ritobin::Hash,_(ritobin::Category)4>::from_json
          (ErrorStackOption *__return_storage_ptr__,Hash *value,json *json)

{
  bool bVar1;
  undefined8 local_17;
  undefined4 local_f;
  undefined2 local_b;
  undefined1 local_9;
  
  bVar1 = hash_from_json<ritobin::FNV1a>(&value->value,json);
  if (bVar1) {
    (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)
    ._M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
    super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_engaged = false;
  }
  else {
    (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)
    ._M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
    super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.type =
         "hash";
    (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)
    ._M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
    super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.message =
         "hash_from_json(value.value, json)";
    (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)
    ._M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
    super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.path.
    _M_dataplus._M_p =
         (pointer)((long)&(__return_storage_ptr__->
                          super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>).
                          _M_payload.
                          super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>
                          .super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>.
                          _M_payload + 0x20);
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
             super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
             super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload + 0x20) = 0
    ;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
             super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
             super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.
             path.field_2 + 1) = local_17;
    *(undefined4 *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
             super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
             super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload + 0x29) =
         local_f;
    *(undefined2 *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
             super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
             super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload + 0x2d) =
         local_b;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)._M_payload.
             super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
             super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload + 0x2f) =
         local_9;
    (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)
    ._M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
    super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_payload._M_value.path.
    _M_string_length = 0;
    (__return_storage_ptr__->super__Optional_base<ritobin::io::json_impl::ErrorStack,_false,_false>)
    ._M_payload.super__Optional_payload<ritobin::io::json_impl::ErrorStack,_true,_false,_false>.
    super__Optional_payload_base<ritobin::io::json_impl::ErrorStack>._M_engaged = true;
  }
  return __return_storage_ptr__;
}

Assistant:

static ErrorStackOption from_json(T& value, json const& json) noexcept {
            bin_json_assert(hash_from_json(value.value, json));
            return std::nullopt;
        }